

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

int target_add_call_res_op
              (c2m_ctx_t c2m_ctx,type *ret_type,target_arg_info_t *arg_info,
              size_t call_arg_area_offset)

{
  gen_ctx_conflict *pgVar1;
  MIR_op_t obj;
  MIR_op_t obj_00;
  MIR_op_t obj_01;
  MIR_op_t op2;
  MIR_op_t op3;
  MIR_op_t op1;
  MIR_context_t pMVar2;
  int iVar3;
  MIR_type_t t;
  MIR_reg_t reg;
  mir_size_t disp;
  op_t local_1f8;
  MIR_op_t local_1b8;
  MIR_op_t local_188;
  MIR_op_t local_158;
  op_t local_128;
  op_t local_e8;
  int local_a0;
  int local_9c;
  int n_qwords;
  int i;
  op_t temp;
  MIR_type_t local_4c [2];
  MIR_type_t qword_types [2];
  MIR_type_t type;
  MIR_context_t ctx;
  gen_ctx_t_conflict gen_ctx;
  size_t call_arg_area_offset_local;
  target_arg_info_t *arg_info_local;
  type *ret_type_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar1 = c2m_ctx->gen_ctx;
  unique0x00012000 = c2m_ctx->ctx;
  iVar3 = void_type_p(ret_type);
  if (iVar3 == 0) {
    local_a0 = process_ret_type(c2m_ctx,ret_type,local_4c);
    if (local_a0 == 0) {
      if ((ret_type->mode == TM_STRUCT) || (ret_type->mode == TM_UNION)) {
        arg_info->n_iregs = arg_info->n_iregs + 1;
        get_new_temp(&local_128,c2m_ctx,MIR_T_I64);
        memcpy(&n_qwords,&local_128,0x40);
        pMVar2 = stack0xffffffffffffffc0;
        reg = MIR_reg(stack0xffffffffffffffc0,FP_NAME,(pgVar1->curr_func->u).func);
        MIR_new_reg_op(&local_158,pMVar2,reg);
        MIR_new_int_op(&local_188,stack0xffffffffffffffc0,call_arg_area_offset);
        op1._8_8_ = temp.mir_op.data;
        op1.data = (void *)temp._8_8_;
        op1.u.reg = temp.mir_op._8_4_;
        op1.u.mem.alias = temp.mir_op._12_4_;
        op1.u._8_8_ = temp.mir_op.u.i;
        op1.u._16_8_ = temp.mir_op.u.str.s;
        op1.u.mem.disp = temp.mir_op.u._16_8_;
        op2._8_8_ = local_158._8_8_;
        op2.data = local_158.data;
        op2.u.i = local_158.u.i;
        op2.u.str.s = local_158.u.str.s;
        op2.u._16_8_ = local_158.u._16_8_;
        op2.u.mem.disp = local_158.u.mem.disp;
        op3._8_8_ = local_188._8_8_;
        op3.data = local_188.data;
        op3.u.i = local_188.u.i;
        op3.u.str.s = local_188.u.str.s;
        op3.u._16_8_ = local_188.u._16_8_;
        op3.u.mem.disp = local_188.u.mem.disp;
        emit3(c2m_ctx,MIR_ADD,op1,op2,op3);
        pMVar2 = stack0xffffffffffffffc0;
        disp = type_size(c2m_ctx,ret_type);
        MIR_new_mem_op(&local_1b8,pMVar2,MIR_T_RBLK,disp,temp.mir_op._8_4_,0,'\x01');
        memcpy(&temp.field_0x8,&local_1b8,0x30);
        obj_00.u.mem.alias = temp.mir_op._12_4_;
        obj_00.u.reg = temp.mir_op._8_4_;
        obj_00._8_8_ = temp.mir_op.data;
        obj_00.data = (void *)temp._8_8_;
        obj_00.u._8_8_ = temp.mir_op.u.i;
        obj_00.u._16_8_ = temp.mir_op.u.str.s;
        obj_00.u.mem.disp = temp.mir_op.u._16_8_;
        VARR_MIR_op_tpush(pgVar1->call_ops,obj_00);
        c2m_ctx_local._4_4_ = 0;
      }
      else {
        qword_types[0] = get_mir_type(c2m_ctx,ret_type);
        qword_types[0] = promote_mir_int_type(qword_types[0]);
        get_new_temp(&local_1f8,c2m_ctx,qword_types[0]);
        memcpy(&n_qwords,&local_1f8,0x40);
        obj_01.u.mem.alias = temp.mir_op._12_4_;
        obj_01.u.reg = temp.mir_op._8_4_;
        obj_01._8_8_ = temp.mir_op.data;
        obj_01.data = (void *)temp._8_8_;
        obj_01.u._8_8_ = temp.mir_op.u.i;
        obj_01.u._16_8_ = temp.mir_op.u.str.s;
        obj_01.u.mem.disp = temp.mir_op.u._16_8_;
        VARR_MIR_op_tpush(pgVar1->call_ops,obj_01);
        c2m_ctx_local._4_4_ = 1;
      }
    }
    else {
      for (local_9c = 0; local_9c < local_a0; local_9c = local_9c + 1) {
        t = promote_mir_int_type(qword_types[(long)local_9c + -2]);
        get_new_temp(&local_e8,c2m_ctx,t);
        memcpy(&n_qwords,&local_e8,0x40);
        obj.u.mem.alias = temp.mir_op._12_4_;
        obj.u.reg = temp.mir_op._8_4_;
        obj._8_8_ = temp.mir_op.data;
        obj.data = (void *)temp._8_8_;
        obj.u._8_8_ = temp.mir_op.u.i;
        obj.u._16_8_ = temp.mir_op.u.str.s;
        obj.u.mem.disp = temp.mir_op.u._16_8_;
        VARR_MIR_op_tpush(pgVar1->call_ops,obj);
      }
      c2m_ctx_local._4_4_ = local_a0;
    }
  }
  else {
    c2m_ctx_local._4_4_ = -1;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int target_add_call_res_op (c2m_ctx_t c2m_ctx, struct type *ret_type,
                                   target_arg_info_t *arg_info, size_t call_arg_area_offset) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_type_t qword_types[MAX_QWORDS];
  op_t temp;
  int i, n_qwords;

  if (void_type_p (ret_type)) return -1;
  n_qwords = process_ret_type (c2m_ctx, ret_type, qword_types);
  if (n_qwords != 0) {
    for (i = 0; i < n_qwords; i++) {
      temp = get_new_temp (c2m_ctx, promote_mir_int_type (qword_types[i]));
      VARR_PUSH (MIR_op_t, call_ops, temp.mir_op);
    }
    return n_qwords;
  } else if (ret_type->mode == TM_STRUCT || ret_type->mode == TM_UNION) { /* return by reference */
    arg_info->n_iregs++;
    temp = get_new_temp (c2m_ctx, MIR_T_I64);
    emit3 (c2m_ctx, MIR_ADD, temp.mir_op,
           MIR_new_reg_op (ctx, MIR_reg (ctx, FP_NAME, curr_func->u.func)),
           MIR_new_int_op (ctx, call_arg_area_offset));
    temp.mir_op
      = MIR_new_mem_op (ctx, MIR_T_RBLK, type_size (c2m_ctx, ret_type), temp.mir_op.u.reg, 0, 1);
    VARR_PUSH (MIR_op_t, call_ops, temp.mir_op);
    return 0;
  } else {
    type = get_mir_type (c2m_ctx, ret_type);
    type = promote_mir_int_type (type);
    temp = get_new_temp (c2m_ctx, type);
    VARR_PUSH (MIR_op_t, call_ops, temp.mir_op);
    return 1;
  }
}